

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O0

SUNErrCode
N_VWrmsNormMaskVectorArray_Serial(int nvec,N_Vector *X,N_Vector *W,N_Vector id,sunrealtype *nrm)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long *in_RCX;
  long in_RDX;
  undefined8 *in_RSI;
  int in_EDI;
  sunrealtype *in_R8;
  sunrealtype sVar4;
  sunrealtype *idd;
  sunrealtype *xd;
  sunrealtype *wd;
  sunindextype N;
  sunindextype j;
  int i;
  SUNContext sunctx_local_scope_;
  sunrealtype local_68;
  N_Vector in_stack_ffffffffffffffb8;
  long lVar5;
  N_Vector in_stack_ffffffffffffffc0;
  long lVar6;
  int local_34;
  
  if (in_EDI == 1) {
    sVar4 = N_VWrmsNormMask_Serial
                      (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,(N_Vector)0x0);
    *in_R8 = sVar4;
  }
  else {
    lVar5 = **(long **)*in_RSI;
    lVar1 = *(long *)(*in_RCX + 0x10);
    for (local_34 = 0; local_34 < in_EDI; local_34 = local_34 + 1) {
      lVar2 = *(long *)(*(long *)in_RSI[local_34] + 0x10);
      lVar3 = *(long *)(**(long **)(in_RDX + (long)local_34 * 8) + 0x10);
      in_R8[local_34] = 0.0;
      for (lVar6 = 0; lVar6 < lVar5; lVar6 = lVar6 + 1) {
        if (0.0 < *(double *)(lVar1 + lVar6 * 8)) {
          in_R8[local_34] =
               *(double *)(lVar2 + lVar6 * 8) * *(double *)(lVar3 + lVar6 * 8) *
               *(double *)(lVar2 + lVar6 * 8) * *(double *)(lVar3 + lVar6 * 8) + in_R8[local_34];
        }
      }
      if (0.0 < in_R8[local_34] / (double)lVar5) {
        local_68 = sqrt(in_R8[local_34] / (double)lVar5);
      }
      else {
        local_68 = 0.0;
      }
      in_R8[local_34] = local_68;
    }
  }
  return 0;
}

Assistant:

SUNErrCode N_VWrmsNormMaskVectorArray_Serial(int nvec, N_Vector* X, N_Vector* W,
                                             N_Vector id, sunrealtype* nrm)
{
  SUNFunctionBegin(X[0]->sunctx);
  int i;
  sunindextype j, N;
  sunrealtype* wd  = NULL;
  sunrealtype* xd  = NULL;
  sunrealtype* idd = NULL;

  /* invalid number of vectors */
  SUNAssert(nvec >= 1, SUN_ERR_ARG_OUTOFRANGE);

  /* should have called N_VWrmsNorm */
  if (nvec == 1)
  {
    nrm[0] = N_VWrmsNormMask_Serial(X[0], W[0], id);
    SUNCheckLastErr();
    return SUN_SUCCESS;
  }

  /* get vector length and mask data array */
  N   = NV_LENGTH_S(X[0]);
  idd = NV_DATA_S(id);

  /* compute the WRMS norm for each vector in the vector array */
  for (i = 0; i < nvec; i++)
  {
    xd     = NV_DATA_S(X[i]);
    wd     = NV_DATA_S(W[i]);
    nrm[i] = ZERO;
    for (j = 0; j < N; j++)
    {
      if (idd[j] > ZERO) { nrm[i] += SUNSQR(xd[j] * wd[j]); }
    }
    nrm[i] = SUNRsqrt(nrm[i] / N);
  }

  return SUN_SUCCESS;
}